

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::RenderDeviceVkImpl::~RenderDeviceVkImpl(RenderDeviceVkImpl *this)

{
  RenderPassCache *this_00;
  __node_base *p_Var1;
  string msg;
  
  VulkanDynamicMemoryManager::Destroy(&this->m_DynamicMemoryManager);
  this_00 = (this->m_ImplicitRenderPassCache)._M_t.
            super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
            .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
  if (this_00 != (RenderPassCache *)0x0) {
    RenderPassCache::Destroy(this_00);
  }
  IdleGPU(this);
  ReleaseStaleResources(this,true);
  if (*(int *)&(this->m_DescriptorSetAllocator).super_DescriptorPoolManager.field_0xc4 != 0) {
    FormatString<char[59]>
              (&msg,(char (*) [59])"All allocated descriptor sets must have been released now.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe3);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_DynamicDescriptorPool).m_AllocatedPoolCounter.super___atomic_base<int>._M_i != 0) {
    FormatString<char[68]>
              (&msg,(char (*) [68])
                    "All allocated dynamic descriptor pools must have been released now.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe4);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_DynamicMemoryManager).super_MasterBlockListBasedManager.m_MasterBlockCounter.
      super___atomic_base<int>._M_i != 0) {
    FormatString<char[73]>
              (&msg,(char (*) [73])
                    "All allocated dynamic master blocks must have been returned to the pool.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe5);
    std::__cxx11::string::~string((string *)&msg);
  }
  p_Var1 = &(this->m_TransientCmdPoolMgrs)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (*(int *)&p_Var1[0x1b]._M_nxt != 0) {
      FormatString<char[208]>
                (&msg,(char (*) [208])
                      "All allocated transient command pools must have been released now. If there are outstanding references to the pools in release queues, the app will crash when CommandPoolManager::FreeCommandPool() is called."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"~RenderDeviceVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
                 ,0xea);
      std::__cxx11::string::~string((string *)&msg);
    }
    CommandPoolManager::DestroyPools((CommandPoolManager *)(p_Var1 + 2));
  }
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::DestroyCommandQueues
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            );
  std::unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>::~unique_ptr
            (&this->m_pDxCompiler);
  VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager(&this->m_DynamicMemoryManager);
  VulkanUtilities::VulkanMemoryManager::~VulkanMemoryManager(&this->m_MemoryMgr);
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::~vector(&this->m_QueryMgrs);
  std::
  _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_TransientCmdPoolMgrs)._M_h);
  DescriptorPoolManager::~DescriptorPoolManager(&this->m_DynamicDescriptorPool);
  DescriptorSetAllocator::~DescriptorSetAllocator(&this->m_DescriptorSetAllocator);
  std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
  ~unique_ptr(&this->m_ImplicitRenderPassCache);
  std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
  ~unique_ptr(&this->m_FramebufferCache);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  ::~unique_ptr(&this->m_PhysicalDevice);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_VulkanInstance).
              super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::~RenderDeviceNextGenBase
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            );
  return;
}

Assistant:

RenderDeviceVkImpl::~RenderDeviceVkImpl()
{
    // Explicitly destroy dynamic heap. This will move resources owned by
    // the heap into release queues
    m_DynamicMemoryManager.Destroy();

    // Explicitly destroy render pass cache
    if (m_ImplicitRenderPassCache)
    {
        m_ImplicitRenderPassCache->Destroy();
    }

    // Wait for the GPU to complete all its operations
    IdleGPU();

    ReleaseStaleResources(true);

    DEV_CHECK_ERR(m_DescriptorSetAllocator.GetAllocatedDescriptorSetCounter() == 0, "All allocated descriptor sets must have been released now.");
    DEV_CHECK_ERR(m_DynamicDescriptorPool.GetAllocatedPoolCounter() == 0, "All allocated dynamic descriptor pools must have been released now.");
    DEV_CHECK_ERR(m_DynamicMemoryManager.GetMasterBlockCounter() == 0, "All allocated dynamic master blocks must have been returned to the pool.");

    // Immediately destroys all command pools
    for (auto& CmdPool : m_TransientCmdPoolMgrs)
    {
        DEV_CHECK_ERR(CmdPool.second.GetAllocatedPoolCount() == 0, "All allocated transient command pools must have been released now. If there are outstanding references to the pools in release queues, the app will crash when CommandPoolManager::FreeCommandPool() is called.");
        CmdPool.second.DestroyPools();
    }

    // We must destroy command queues explicitly prior to releasing Vulkan device
    DestroyCommandQueues();

    //if(m_PhysicalDevice)
    //{
    //    // If m_PhysicalDevice is empty, the device does not own vulkan logical device and must not
    //    // destroy it
    //    vkDestroyDevice(m_VkDevice, m_VulkanInstance->GetVkAllocator());
    //}
}